

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result __thiscall
testing::Action<const_solitaire::interfaces::Solitaire_&()>::Perform
          (Action<const_solitaire::interfaces::Solitaire_&()> *this)

{
  Solitaire *pSVar1;
  
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  pSVar1 = std::function<const_solitaire::interfaces::Solitaire_&()>::operator()(&this->fun_);
  return pSVar1;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }